

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ProgramStateQueryTests::init
          (ProgramStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  Context *pCVar2;
  TestCase *pTVar3;
  undefined8 uVar4;
  undefined8 extraout_RAX;
  long lVar5;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar3 = (TestCase *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"program_separable_",&local_71);
  std::operator+(&local_50,&local_70,"get_programiv");
  TestCase::TestCase(pTVar3,pCVar2,local_50._M_dataplus._M_p,"Test PROGRAM_SEPARABLE");
  (pTVar3->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a14598;
  *(undefined4 *)&pTVar3[1].super_TestCase.super_TestNode._vptr_TestNode = 0x12;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  pTVar3 = (TestCase *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"compute_work_group_size_",&local_71);
  std::operator+(&local_50,&local_70,"get_programiv");
  TestCase::TestCase(pTVar3,pCVar2,local_50._M_dataplus._M_p,"Test COMPUTE_WORK_GROUP_SIZE");
  (pTVar3->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a145e8;
  *(undefined4 *)&pTVar3[1].super_TestCase.super_TestNode._vptr_TestNode = 0x13;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  pTVar3 = (TestCase *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"active_atomic_counter_buffers_",&local_71);
  std::operator+(&local_50,&local_70,"get_programiv");
  TestCase::TestCase(pTVar3,pCVar2,local_50._M_dataplus._M_p,"Test ACTIVE_ATOMIC_COUNTER_BUFFERS");
  (pTVar3->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a14638;
  *(undefined4 *)&pTVar3[1].super_TestCase.super_TestNode._vptr_TestNode = 0x12;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  pTVar3 = (TestCase *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"geometry_shader_state_",&local_71);
  std::operator+(&local_50,&local_70,"get_programiv");
  TestCase::TestCase(pTVar3,pCVar2,local_50._M_dataplus._M_p,"Test Geometry Shader State");
  (pTVar3->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a14688;
  *(undefined4 *)&pTVar3[1].super_TestCase.super_TestNode._vptr_TestNode = 0x12;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  pTVar3 = (TestCase *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"tesselation_shader_state_",&local_71);
  std::operator+(&local_50,&local_70,"get_programiv");
  TestCase::TestCase(pTVar3,pCVar2,local_50._M_dataplus._M_p,"Test Tesselation Shader State");
  (pTVar3->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a146d8;
  *(undefined4 *)&pTVar3[1].super_TestCase.super_TestNode._vptr_TestNode = 0x12;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  std::__cxx11::string::~string((string *)&local_50);
  uVar4 = std::__cxx11::string::~string((string *)&local_70);
  for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 0x10) {
    pTVar3 = (TestCase *)operator_new(0x80);
    uVar1 = *(undefined4 *)((long)&init::shaderTypes[0].caseType + lVar5);
    TestCase::TestCase(pTVar3,(this->super_TestCaseGroup).m_context,
                       *(char **)((long)&init::shaderTypes[0].caseName + lVar5),
                       SSBOArrayLengthTests::init::arraysSized + 1);
    (pTVar3->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a14728;
    *(undefined4 *)&pTVar3[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
    uVar4 = extraout_RAX;
  }
  return (int)uVar4;
}

Assistant:

void ProgramStateQueryTests::init (void)
{
	static const QueryType intVerifiers[] =
	{
		QUERY_PROGRAM_INTEGER,
	};
	static const QueryType intVec3Verifiers[] =
	{
		QUERY_PROGRAM_INTEGER_VEC3,
	};

#define FOR_EACH_INT_VERIFIER(X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(intVerifiers); ++verifierNdx)	\
	{																							\
		const char* verifierSuffix = getVerifierSuffix(intVerifiers[verifierNdx]);				\
		const QueryType verifier = intVerifiers[verifierNdx];									\
		this->addChild(X);																		\
	}

#define FOR_EACH_VEC_VERIFIER(X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(intVec3Verifiers); ++verifierNdx)	\
	{																								\
		const char* verifierSuffix = getVerifierSuffix(intVec3Verifiers[verifierNdx]);				\
		const QueryType verifier = intVec3Verifiers[verifierNdx];									\
		this->addChild(X);																			\
	}

	FOR_EACH_INT_VERIFIER(new ProgramSeparableCase				(m_context, verifier, (std::string("program_separable_") + verifierSuffix).c_str(),				"Test PROGRAM_SEPARABLE"));
	FOR_EACH_VEC_VERIFIER(new ComputeWorkGroupSizeCase			(m_context, verifier, (std::string("compute_work_group_size_") + verifierSuffix).c_str(),		"Test COMPUTE_WORK_GROUP_SIZE"));
	FOR_EACH_INT_VERIFIER(new ActiveAtomicCounterBuffersCase	(m_context, verifier, (std::string("active_atomic_counter_buffers_") + verifierSuffix).c_str(),	"Test ACTIVE_ATOMIC_COUNTER_BUFFERS"));
	FOR_EACH_INT_VERIFIER(new GeometryShaderCase				(m_context, verifier, (std::string("geometry_shader_state_") + verifierSuffix).c_str(),			"Test Geometry Shader State"));
	FOR_EACH_INT_VERIFIER(new TessellationShaderCase			(m_context, verifier, (std::string("tesselation_shader_state_") + verifierSuffix).c_str(),		"Test Tesselation Shader State"));

#undef FOR_EACH_INT_VERIFIER
#undef FOR_EACH_VEC_VERIFIER

	// program info log tests
	// \note, there exists similar tests in gles3 module. However, the gles31 could use a different
	//        shader compiler with different INFO_LOG bugs.
	{
		static const struct
		{
			const char*						caseName;
			ProgramLogCase::BuildErrorType	caseType;
		} shaderTypes[] =
		{
			{ "info_log_vertex_fragment_link_fail",		ProgramLogCase::BUILDERROR_VERTEX_FRAGMENT	},
			{ "info_log_compute_link_fail",				ProgramLogCase::BUILDERROR_COMPUTE			},
			{ "info_log_geometry_link_fail",			ProgramLogCase::BUILDERROR_GEOMETRY			},
			{ "info_log_tessellation_link_fail",		ProgramLogCase::BUILDERROR_TESSELLATION		},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(shaderTypes); ++ndx)
			addChild(new ProgramLogCase(m_context, shaderTypes[ndx].caseName, "", shaderTypes[ndx].caseType));
	}
}